

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManPrint(If_DsdMan_t *p,char *pFileName,int Number,int Support,int fOccurs,int fTtDump,
                   int fVerbose)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  If_DsdObj_t *pIVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  double dVar10;
  undefined1 auVar11 [16];
  FILE *pFile;
  int local_70;
  int MemSizeDecs;
  int MemSizeTTs;
  int DsdMax;
  int *pPerm;
  int local_58;
  int v;
  int i;
  int CountPrime;
  int CountMarked;
  int CountNonDsdStr;
  int CountNonDsd;
  int CountUsed;
  Vec_Int_t *vCounts;
  Vec_Int_t *vStructs;
  If_DsdObj_t *pObj;
  int fTtDump_local;
  int fOccurs_local;
  int Support_local;
  int Number_local;
  char *pFileName_local;
  If_DsdMan_t *p_local;
  
  MemSizeDecs = 0;
  local_70 = 0;
  pFile._4_4_ = 0;
  __stream = _stdout;
  if ((pFileName == (char *)0x0) || (__stream = fopen(pFileName,"wb"), __stream != (FILE *)0x0)) {
    if (fVerbose != 0) {
      fprintf(__stream,"*****  NOTATIONS USED BELOW  *****\n");
      fprintf(__stream,"Support -- the support size\n");
      fprintf(__stream,"Obj     -- the number of nodes in the DSD manager for each support size\n");
      fprintf(__stream,"           (the constant node and the primary input node have no support)\n"
             );
      fprintf(__stream,
              "ObjNDSD -- the number of prime nodes (that is, nodes whose function has no DSD)\n");
      fprintf(__stream,
              "           (percentage is relative to the number of all nodes of that size)\n");
      fprintf(__stream,"NPNNDSD -- the number of different NPN classes of prime nodes\n");
      fprintf(__stream,
              "           (Each NPN class may appear more than once. For example: F1 = 17(ab(cd))\n"
             );
      fprintf(__stream,
              "           and F2 = 17(ab[cd]) both have prime majority node (hex TT is 17),\n");
      fprintf(__stream,
              "           but in one case the majority node is fed by AND, and in another by XOR.\n"
             );
      fprintf(__stream,
              "           These two majority nodes are different nodes in the DSD manager\n");
      fprintf(__stream,"Str     -- the number of structures for each support size\n");
      fprintf(__stream,"           (each structure is composed of one or more nodes)\n");
      fprintf(__stream,
              "StrNDSD -- the number of DSD structures containing at least one prime node\n");
      fprintf(__stream,
              "Marked  -- the number of DSD structures matchable with the LUT structure (say, \"44\")\n"
             );
    }
    for (local_58 = 0; iVar3 = Vec_PtrSize(&p->vObjs), local_58 < iVar3; local_58 = local_58 + 1) {
      pIVar6 = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,local_58);
      iVar3 = If_DsdObjType(pIVar6);
      if (iVar3 == 6) {
        MemSizeDecs = Abc_MaxInt(MemSizeDecs,*(uint *)&pIVar6->field_0x4 >> 0x1b);
      }
      If_DsdObjType(pIVar6);
      If_DsdManCheckNonDec_rec(p,pIVar6->Id);
      If_DsdVecObjRef(&p->vObjs,pIVar6->Id);
      If_DsdVecObjMark(&p->vObjs,local_58);
    }
    for (pPerm._4_4_ = 3; pPerm._4_4_ <= p->nVars; pPerm._4_4_ = pPerm._4_4_ + 1) {
      Vec_MemEntryNum(p->vTtMem[pPerm._4_4_]);
      iVar3 = Vec_MemEntrySize(p->vTtMem[pPerm._4_4_]);
      iVar4 = Vec_MemEntryNum(p->vTtMem[pPerm._4_4_]);
      local_70 = iVar3 * iVar4 + local_70;
      dVar10 = Vec_VecMemoryInt((Vec_Vec_t *)p->vTtDecs[pPerm._4_4_]);
      pFile._4_4_ = (int)dVar10 + pFile._4_4_;
    }
    If_DsdManPrintDistrib(p);
    uVar5 = p->nVars;
    uVar2 = p->LutSize;
    iVar3 = If_DsdManHasMarks(p);
    pcVar8 = "no";
    if (iVar3 != 0) {
      pcVar8 = "yes";
    }
    pcVar9 = "no";
    if (p->fNewAsUseless != 0) {
      pcVar9 = "yes";
    }
    printf("Number of inputs = %d.  LUT size = %d.  Marks = %s.  NewAsUseless = %s.  Bookmark = %d.\n"
           ,(ulong)uVar5,(ulong)uVar2,pcVar8,pcVar9,(ulong)(uint)p->nObjsPrev);
    if (p->pCellStr != (char *)0x0) {
      printf("Symbolic cell description: %s\n",p->pCellStr);
    }
    if (p->pTtGia != (Gia_Man_t *)0x0) {
      uVar5 = Gia_ManAndNum(p->pTtGia);
      fprintf(__stream,"Non-DSD AIG nodes          = %8d\n",(ulong)uVar5);
    }
    fprintf(__stream,"Unique table misses        = %8d\n",(ulong)(uint)p->nUniqueMisses);
    fprintf(__stream,"Unique table hits          = %8d\n",(ulong)(uint)p->nUniqueHits);
    iVar3 = Mem_FlexReadMemUsage(p->pMem);
    fprintf(__stream,"Memory used for objects    = %8.2f MB.\n",(double)iVar3 * 9.5367431640625e-07)
    ;
    iVar3 = Vec_IntCap(&p->vTruths);
    lVar1 = (long)local_70 + (long)iVar3 * 4;
    auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar11._0_8_ = lVar1;
    auVar11._12_4_ = 0x45300000;
    fprintf(__stream,"Memory used for functions  = %8.2f MB.\n",
            (((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 8.0) / 1048576.0);
    iVar3 = p->nBins;
    iVar4 = Vec_IntCap(&p->vNexts);
    fprintf(__stream,"Memory used for hash table = %8.2f MB.\n",
            ((double)(iVar3 + iVar4) * 4.0) / 1048576.0);
    fprintf(__stream,"Memory used for bound sets = %8.2f MB.\n",
            ((double)pFile._4_4_ * 1.0) / 1048576.0);
    iVar3 = Vec_PtrCap(&p->vObjs);
    fprintf(__stream,"Memory used for array      = %8.2f MB.\n",((double)iVar3 * 8.0) / 1048576.0);
    if (p->pTtGia != (Gia_Man_t *)0x0) {
      iVar3 = Gia_ManAndNum(p->pTtGia);
      fprintf(__stream,"Memory used for AIG        = %8.2f MB.\n",((double)iVar3 * 8.0) / 1048576.0)
      ;
    }
    if (p->timeDsd != 0) {
      Abc_PrintTime(1,"Time DSD   ",p->timeDsd);
      Abc_PrintTime(1,"Time canon ",p->timeCanon - p->timeCheck);
      Abc_PrintTime(1,"Time check ",p->timeCheck);
      Abc_PrintTime(1,"Time check2",p->timeCheck2);
      Abc_PrintTime(1,"Time verify",p->timeVerify);
    }
    if (fOccurs != 0) {
      If_DsdManPrintOccurs((FILE *)_stdout,p);
    }
    if (fTtDump != 0) {
      If_DsdManDumpDsd(p,Support);
      If_DsdManDumpAll(p,Support);
    }
    if (fVerbose != 0) {
      p_00 = Vec_IntAlloc(1000);
      p_01 = Vec_IntAlloc(1000);
      for (local_58 = 0; iVar3 = Vec_PtrSize(&p->vObjs), local_58 < iVar3; local_58 = local_58 + 1)
      {
        pIVar6 = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,local_58);
        if (((Number == 0) || (local_58 % Number == 0)) &&
           ((Support == 0 || (iVar3 = If_DsdObjSuppSize(pIVar6), Support == iVar3)))) {
          Vec_IntPush(p_00,local_58);
          Vec_IntPush(p_01,-(*(uint *)&pIVar6->field_0x4 >> 9 & 0x3ffff));
        }
      }
      piVar7 = Vec_IntArray(p_01);
      iVar3 = Vec_IntSize(p_01);
      piVar7 = Abc_MergeSortCost(piVar7,iVar3);
      local_58 = 0;
      while( true ) {
        iVar3 = Vec_IntSize(p_01);
        iVar3 = Abc_MinInt(iVar3,0x14);
        if (iVar3 <= local_58) break;
        printf("%2d : ",(ulong)(local_58 + 1));
        iVar3 = Vec_IntEntry(p_00,piVar7[local_58]);
        pIVar6 = If_DsdVecObj(&p->vObjs,iVar3);
        If_DsdManPrintOne((FILE *)__stream,p,pIVar6->Id,(uchar *)0x0,1);
        local_58 = local_58 + 1;
      }
      if (piVar7 != (int *)0x0) {
        free(piVar7);
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      if (pFileName != (char *)0x0) {
        fclose(__stream);
      }
    }
  }
  else {
    printf("cannot open output file\n");
  }
  return;
}

Assistant:

void If_DsdManPrint( If_DsdMan_t * p, char * pFileName, int Number, int Support, int fOccurs, int fTtDump, int fVerbose )
{
    If_DsdObj_t * pObj;
    Vec_Int_t * vStructs, * vCounts;
    int CountUsed = 0, CountNonDsd = 0, CountNonDsdStr = 0, CountMarked = 0, CountPrime = 0;
    int i, v, * pPerm, DsdMax = 0, MemSizeTTs = 0, MemSizeDecs = 0;
    FILE * pFile;
    pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFileName && pFile == NULL )
    {
        printf( "cannot open output file\n" );
        return;
    }
    if ( fVerbose )
    {
        fprintf( pFile, "*****  NOTATIONS USED BELOW  *****\n" );
        fprintf( pFile, "Support -- the support size\n" );
        fprintf( pFile, "Obj     -- the number of nodes in the DSD manager for each support size\n" );
        fprintf( pFile, "           (the constant node and the primary input node have no support)\n" );
        fprintf( pFile, "ObjNDSD -- the number of prime nodes (that is, nodes whose function has no DSD)\n" );
        fprintf( pFile, "           (percentage is relative to the number of all nodes of that size)\n" );
        fprintf( pFile, "NPNNDSD -- the number of different NPN classes of prime nodes\n" );
        fprintf( pFile, "           (Each NPN class may appear more than once. For example: F1 = 17(ab(cd))\n" ); 
        fprintf( pFile, "           and F2 = 17(ab[cd]) both have prime majority node (hex TT is 17),\n" ); 
        fprintf( pFile, "           but in one case the majority node is fed by AND, and in another by XOR.\n" );
        fprintf( pFile, "           These two majority nodes are different nodes in the DSD manager\n" );
        fprintf( pFile, "Str     -- the number of structures for each support size\n" );
        fprintf( pFile, "           (each structure is composed of one or more nodes)\n" );
        fprintf( pFile, "StrNDSD -- the number of DSD structures containing at least one prime node\n" );
        fprintf( pFile, "Marked  -- the number of DSD structures matchable with the LUT structure (say, \"44\")\n" );
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
            DsdMax = Abc_MaxInt( DsdMax, pObj->nFans ); 
        CountPrime += If_DsdObjType(pObj) == IF_DSD_PRIME;
        CountNonDsdStr += If_DsdManCheckNonDec_rec( p, pObj->Id );
        CountUsed += ( If_DsdVecObjRef(&p->vObjs, pObj->Id) > 0 );
        CountMarked += If_DsdVecObjMark( &p->vObjs, i );
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        CountNonDsd += Vec_MemEntryNum(p->vTtMem[v]);
        MemSizeTTs += Vec_MemEntrySize(p->vTtMem[v]) * Vec_MemEntryNum(p->vTtMem[v]);
        MemSizeDecs += (int)Vec_VecMemoryInt((Vec_Vec_t *)(p->vTtDecs[v]));
    }
    If_DsdManPrintDistrib( p );
    printf( "Number of inputs = %d.  LUT size = %d.  Marks = %s.  NewAsUseless = %s.  Bookmark = %d.\n", 
        p->nVars, p->LutSize, If_DsdManHasMarks(p)? "yes" : "no", p->fNewAsUseless? "yes" : "no", p->nObjsPrev );
    if ( p->pCellStr )
        printf( "Symbolic cell description: %s\n", p->pCellStr );
    if ( p->pTtGia )
    fprintf( pFile, "Non-DSD AIG nodes          = %8d\n", Gia_ManAndNum(p->pTtGia) );
    fprintf( pFile, "Unique table misses        = %8d\n", p->nUniqueMisses );
    fprintf( pFile, "Unique table hits          = %8d\n", p->nUniqueHits );
    fprintf( pFile, "Memory used for objects    = %8.2f MB.\n", 1.0*Mem_FlexReadMemUsage(p->pMem)/(1<<20) );
    fprintf( pFile, "Memory used for functions  = %8.2f MB.\n", 8.0*(MemSizeTTs+sizeof(int)*Vec_IntCap(&p->vTruths))/(1<<20) );
    fprintf( pFile, "Memory used for hash table = %8.2f MB.\n", 1.0*sizeof(int)*(p->nBins+Vec_IntCap(&p->vNexts))/(1<<20) );
    fprintf( pFile, "Memory used for bound sets = %8.2f MB.\n", 1.0*MemSizeDecs/(1<<20) );
    fprintf( pFile, "Memory used for array      = %8.2f MB.\n", 1.0*sizeof(void *)*Vec_PtrCap(&p->vObjs)/(1<<20) );
    if ( p->pTtGia )
    fprintf( pFile, "Memory used for AIG        = %8.2f MB.\n", 8.0*Gia_ManAndNum(p->pTtGia)/(1<<20) );
    if ( p->timeDsd )
    {
        Abc_PrintTime( 1, "Time DSD   ", p->timeDsd    );
        Abc_PrintTime( 1, "Time canon ", p->timeCanon-p->timeCheck  );
        Abc_PrintTime( 1, "Time check ", p->timeCheck  );
        Abc_PrintTime( 1, "Time check2", p->timeCheck2 );
        Abc_PrintTime( 1, "Time verify", p->timeVerify );
    }
    if ( fOccurs )
        If_DsdManPrintOccurs( stdout, p );
//    If_DsdManHashProfile( p );
    if ( fTtDump )
        If_DsdManDumpDsd( p, Support );
    if ( fTtDump )
        If_DsdManDumpAll( p, Support );
//    If_DsdManPrintDecs( stdout, p );
    if ( !fVerbose )
        return;
    vStructs = Vec_IntAlloc( 1000 );
    vCounts  = Vec_IntAlloc( 1000 );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( Number && i % Number )
            continue;
        if ( Support && Support != If_DsdObjSuppSize(pObj) )
            continue;
        Vec_IntPush( vStructs, i );
        Vec_IntPush( vCounts, -(int)pObj->Count );
//        If_DsdManPrintOne( pFile, p, pObj->Id, NULL, 1 );
    }
//    fprintf( pFile, "\n" );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCounts), Vec_IntSize(vCounts) );
    for ( i = 0; i < Abc_MinInt(Vec_IntSize(vCounts), 20); i++ )
    {
        printf( "%2d : ", i+1 );
        pObj = If_DsdVecObj( &p->vObjs, Vec_IntEntry(vStructs, pPerm[i]) );
        If_DsdManPrintOne( pFile, p, pObj->Id, NULL, 1 );
    }
    ABC_FREE( pPerm );
    Vec_IntFree( vStructs );
    Vec_IntFree( vCounts );
    if ( pFileName )
        fclose( pFile );
}